

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

void LowererMD::LegalizeSrc<true>(Instr *instr,Opnd *src,LegalForms forms)

{
  _func_int **pp_Var1;
  LegalForms LVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  char *message;
  char *error;
  uint lineNumber;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x807,"(instr)","instr");
    if (!bVar4) goto LAB_00671a35;
    *puVar6 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x808,"(src)","src");
    if (!bVar4) goto LAB_00671a35;
    *puVar6 = 0;
  }
  if ((instr->m_src1 != src) && (instr->m_src2 != src)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x809,"(src == instr->GetSrc1() || src == instr->GetSrc2())",
                       "src == instr->GetSrc1() || src == instr->GetSrc2()");
    if (!bVar4) goto LAB_00671a35;
    *puVar6 = 0;
  }
  if (forms == L_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x80a,"(forms)","forms");
    if (!bVar4) goto LAB_00671a35;
    *puVar6 = 0;
  }
  OVar5 = IR::Opnd::GetKind(src);
  switch(OVar5) {
  case OpndKindIntConst:
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    OVar5 = IR::Opnd::GetKind(src);
    if (OVar5 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar4) goto LAB_00671a35;
      *puVar6 = 0;
    }
    if ((TySize[src->m_type] != 8) ||
       (((instr->field_0x36 & 0x20) == 0 &&
        ((_func_int **)(long)(int)src[1]._vptr_Opnd == src[1]._vptr_Opnd)))) {
      LVar2 = forms & L_Imm32;
      goto joined_r0x006717f8;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    error = "(false)";
    message = "IntConstOpnd doesn\'t fit in 32 bits. Missing legalization";
    lineNumber = 0x828;
    break;
  case OpndKindInt64Const:
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    OVar5 = IR::Opnd::GetKind(src);
    if (OVar5 != OpndKindInt64Const) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xe4,"(this->IsInt64ConstOpnd())","Bad call to AsInt64ConstOpnd()");
      if (!bVar4) goto LAB_00671a35;
      *puVar6 = 0;
    }
    if ((forms & L_Imm32) != L_None) {
      if (TySize[src->m_type] != 8) {
        return;
      }
      if (((instr->field_0x36 & 0x20) == 0) &&
         ((_func_int **)(long)(int)src[1]._vptr_Opnd == src[1]._vptr_Opnd)) {
        return;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    error = "(false)";
    message = "Int64ConstOpnd doesn\'t fit in 32 bits. Missing legalization";
    lineNumber = 0x84d;
    break;
  case OpndKindFloatConst:
    goto switchD_006714d3_caseD_3;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x899,"(false)","false");
    if (!bVar4) goto LAB_00671a35;
    *puVar6 = 0;
    goto switchD_006714d3_caseD_3;
  case OpndKindHelperCall:
  case OpndKindLabel:
    if ((instr->field_0x36 & 0x20) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x894,"(!instr->isInlineeEntryInstr)","!instr->isInlineeEntryInstr");
      if (!bVar4) goto LAB_00671a35;
      *puVar6 = 0;
    }
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    error = "(forms & L_Ptr)";
    message = "forms & L_Ptr";
    lineNumber = 0x895;
    break;
  case OpndKindSym:
  case OpndKindIndir:
switchD_006714d3_caseD_7:
    LVar2 = forms & L_Mem;
joined_r0x006717f8:
    if (LVar2 != L_None) {
      return;
    }
    goto switchD_006714d3_caseD_3;
  case OpndKindReg:
    if ((forms & L_Reg) != L_None) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    error = "(forms & L_Reg)";
    message = "forms & L_Reg";
    lineNumber = 0x811;
    break;
  case OpndKindAddr:
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    OVar5 = IR::Opnd::GetKind(src);
    if (OVar5 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) goto LAB_00671a35;
      *puVar6 = 0;
    }
    if ((forms & L_Imm32) != L_None) {
      if (TySize[src->m_type] != 8) {
        return;
      }
      if (((instr->field_0x36 & 0x20) == 0) &&
         ((_func_int **)(long)(int)src[2]._vptr_Opnd == src[2]._vptr_Opnd)) {
        return;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    error = "(false)";
    message = "AddrOpnd doesn\'t fit in 32 bits. Missing legalization";
    lineNumber = 0x86a;
    break;
  case OpndKindMemRef:
    OVar5 = IR::Opnd::GetKind(src);
    if (OVar5 != OpndKindMemRef) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1ec,"(this->IsMemRefOpnd())","Bad call to AsMemRefOpnd()");
      if (!bVar4) goto LAB_00671a35;
      *puVar6 = 0;
    }
    pp_Var1 = src[1]._vptr_Opnd;
    if ((_func_int **)(long)(int)pp_Var1 == pp_Var1) goto switchD_006714d3_caseD_7;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x882,"(false)",
                       "Memory reference not legal in src opnd. Missing legalization");
    if (!bVar4) goto LAB_00671a35;
    *puVar6 = 0;
    if ((forms & L_Mem) != L_None || (ulong)(pp_Var1 + 0x10000000) >> 0x20 != 0) {
      return;
    }
switchD_006714d3_caseD_3:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    error = "(false)";
    message = "Src opnd not legal. Missing legalization";
    lineNumber = 0x89f;
  }
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                     ,lineNumber,error,message);
  if (bVar4) {
    *puVar6 = 0;
    return;
  }
LAB_00671a35:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void LowererMD::LegalizeSrc(IR::Instr *const instr, IR::Opnd *src, const LegalForms forms)
{
    Assert(instr);
    Assert(src);
    Assert(src == instr->GetSrc1() || src == instr->GetSrc2());
    Assert(forms);
#ifndef _M_X64
    AssertMsg(!src->IsInt64() || src->IsMemoryOpnd(), "Int64 supported only on x64");
#endif
    switch(src->GetKind())
    {
        case IR::OpndKindReg:
            Assert(forms & L_Reg);
            return;

        case IR::OpndKindIntConst:
            if(forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::IntConstOpnd * intOpnd = src->AsIntConstOpnd();
                if ((TySize[intOpnd->GetType()] != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord(intOpnd->GetValue())))
                {
                    if (forms & L_Imm32)
                    {
                        // the constant fits in 32-bit, no need to hoist
                        return;
                    }
                    break;
                }
                if (verify)
                {
                    AssertMsg(false, "IntConstOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }
                // The actual value for inlinee entry instr isn't determined until encoder
                // So it need to be hoisted conventionally.
                if (!instr->isInlineeEntryInstr)
                {
                    Assert(forms & L_Reg);
                    IR::IntConstOpnd * newIntOpnd = intOpnd->Copy(instr->m_func)->AsIntConstOpnd();
                    IR::IndirOpnd * indirOpnd = instr->m_func->GetTopFunc()->GetConstantAddressIndirOpnd(intOpnd->GetValue(), newIntOpnd, IR::AddrOpndKindConstantAddress, TyMachPtr, Js::OpCode::MOV);
                    if (HoistLargeConstant(indirOpnd, src, instr))
                    {
                        return;
                    }
                }
            }
#endif
            break;
        case IR::OpndKindFloatConst:
            break; // assume for now that it always needs to be hoisted

        case IR::OpndKindInt64Const:
            if (forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::Int64ConstOpnd * int64Opnd = src->AsInt64ConstOpnd();
                if ((forms & L_Imm32) && ((src->GetSize() != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord(int64Opnd->GetValue()))))
                {
                    // the immediate fits in 32-bit, no need to hoist
                    return;
                }
                if (verify)
                {
                    AssertMsg(false, "Int64ConstOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }

                Assert(forms & L_Reg);
                IR::Opnd* regOpnd = IR::RegOpnd::New(src->GetType(), instr->m_func);
                IR::Instr* moveToReg = IR::Instr::New(Js::OpCode::MOV, regOpnd, src, instr->m_func);
                instr->InsertBefore(moveToReg);
                instr->ReplaceSrc(src, regOpnd);
                return;
            }
#endif
            break;
        case IR::OpndKindAddr:
            if (forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::AddrOpnd * addrOpnd = src->AsAddrOpnd();
                if ((forms & L_Imm32) && ((TySize[addrOpnd->GetType()] != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord((size_t)addrOpnd->m_address))))
                {
                    // the address fits in 32-bit, no need to hoist
                    return;
                }
                if (verify)
                {
                    AssertMsg(false, "AddrOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }

                Assert(!instr->isInlineeEntryInstr);
                Assert(forms & L_Reg);
                // TODO: michhol, remove cast after making m_address intptr
                IR::AddrOpnd * newAddrOpnd = addrOpnd->Copy(instr->m_func)->AsAddrOpnd();
                IR::IndirOpnd * indirOpnd = instr->m_func->GetTopFunc()->GetConstantAddressIndirOpnd((intptr_t)addrOpnd->m_address, newAddrOpnd, addrOpnd->GetAddrOpndKind(), TyMachPtr, Js::OpCode::MOV);
                if (HoistLargeConstant(indirOpnd, src, instr))
                {
                    return;
                }
            }
#endif
            break;

        case IR::OpndKindMemRef:
        {
            IR::MemRefOpnd *const memRefOpnd = src->AsMemRefOpnd();
            if(!LowererMDArch::IsLegalMemLoc(memRefOpnd))
            {
                if (verify)
                {
                    AssertMsg(false, "Memory reference not legal in src opnd. Missing legalization");
                    return;
                }
                src = instr->HoistMemRefAddress(memRefOpnd, Js::OpCode::MOV);
            }
            // fall through
        }

        case IR::OpndKindSym:
        case IR::OpndKindIndir:
            if(forms & L_Mem)
            {
                return;
            }
            break;

        case IR::OpndKindHelperCall:
        case IR::OpndKindLabel:
            Assert(!instr->isInlineeEntryInstr);
            Assert(forms & L_Ptr);
            return;

        default:
            Assert(false);
            __assume(false);
    }

    if (verify)
    {
        AssertMsg(false, "Src opnd not legal. Missing legalization");
        return;
    }

    // Hoist the src into a reg
    Assert(forms & L_Reg);
    Assert(!(instr->GetDst() && instr->GetDst()->IsEqual(src)));
    const Js::OpCode loadOpCode = GetLoadOp(src->GetType());
    if(src == instr->GetSrc2())
    {
        instr->HoistSrc2(loadOpCode);
        return;
    }
    const bool equalsSrc2 = instr->GetSrc2() && src->IsEqual(instr->GetSrc2());
    IR::Instr * hoistInstr = instr->HoistSrc1(loadOpCode);
    if(equalsSrc2)
    {
        instr->ReplaceSrc2(hoistInstr->GetDst());
    }
    hoistInstr->isInlineeEntryInstr = instr->isInlineeEntryInstr;
    instr->isInlineeEntryInstr = false;
}